

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

uint __thiscall
Memory::HeapBlockMap32::GetMarkCount(HeapBlockMap32 *this,void *address,uint pageCount)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  PageMarkBitVector *this_01;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint pageIndex;
  
  uVar5 = (ulong)pageCount;
  uVar6 = (ulong)address >> 0x14 & 0xfff;
  pageIndex = (uint)address >> 0xc & 0xff;
  uVar7 = 0;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    while (this_00 = this->map[uVar6], this_00 == (L2MapChunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0xd9,"(l2map != nullptr)","l2map != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    while (pageIndex < 0x100) {
      this_01 = L2MapChunk::GetPageMarkBitVector(this_00,pageIndex);
      BVar3 = BVStatic<256UL>::Count(this_01);
      uVar7 = uVar7 + BVar3;
      pageIndex = pageIndex + 1;
      uVar5 = uVar5 - 1;
      if (uVar5 == 0) {
        return uVar7;
      }
    }
    uVar6 = (ulong)((int)uVar6 + 1);
    pageIndex = 0;
  } while( true );
}

Assistant:

uint
HeapBlockMap32::GetMarkCount(void * address, uint pageCount)
{
    uint markCount = 0;

    ForEachChunkInAddressRange(address, pageCount, [&](L2MapChunk* l2Map, uint chunkId)
    {
        markCount += l2Map->GetPageMarkBitVector(chunkId /* pageIndex */)->Count();
    });

    return markCount;
}